

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_sjasm.cpp
# Opt level: O3

void dirLUA(void)

{
  lua_State *L;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *buff;
  undefined4 uVar5;
  undefined8 unaff_RBP;
  EStatus EVar6;
  char *__dest;
  EWStatus EVar7;
  char *pcVar8;
  bool bVar9;
  char *id;
  EWStatus warningType;
  TextFilePos luaStartPos;
  char *local_60;
  EWStatus local_54;
  EStatus local_50;
  undefined4 local_4c;
  TextFilePos local_48;
  
  if ((LUA == (lua_State *)0x0) && (lua_impl_init(), LUA == (lua_State *)0x0)) {
    __assert_fail("LUA",
                  "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/lua_sjasm.cpp"
                  ,0x1d2,"void dirLUA()");
  }
  local_60 = GetID(&lp);
  uVar5 = (undefined4)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  EVar6 = PASS3;
  if ((local_60 != (char *)0x0) && (*local_60 != '\0')) {
    bVar2 = false;
    iVar4 = cmphstr(&local_60,"pass1",false);
    EVar7 = W_EARLY;
    if (iVar4 != 0) {
      EVar6 = EARLY;
      iVar4 = 1;
      goto LAB_0011be52;
    }
    bVar2 = false;
    iVar4 = cmphstr(&local_60,"pass2",false);
    if (iVar4 != 0) {
      iVar4 = 2;
      EVar6 = EARLY;
      goto LAB_0011be52;
    }
    iVar4 = cmphstr(&local_60,"pass3",false);
    EVar7 = W_PASS3;
    if (iVar4 == 0) {
      uVar5 = 0;
      iVar4 = cmphstr(&local_60,"allpass",false);
      if (iVar4 == 0) {
        iVar4 = 3;
        Error("[LUA] Syntax error",local_60,PASS3);
        uVar5 = 1;
        bVar2 = false;
        EVar6 = PASS3;
      }
      else {
        bVar2 = true;
        iVar4 = -1;
      }
      goto LAB_0011be52;
    }
  }
  bVar2 = false;
  EVar7 = W_PASS3;
  iVar4 = 3;
LAB_0011be52:
  bVar9 = iVar4 == pass;
  bVar1 = suppressedById(W_LUA_MC_PASS);
  if (sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
      super__Vector_impl_data._M_start ==
      sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __assert_fail("!sourcePosStack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/lua_sjasm.cpp"
                  ,0x1eb,"void dirLUA()");
  }
  local_48.colEnd =
       sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
       super__Vector_impl_data._M_finish[-1].colEnd;
  local_48._20_4_ =
       *(undefined4 *)
        &sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].field_0x14;
  local_48.filename =
       sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
       super__Vector_impl_data._M_finish[-1].filename;
  local_48.line =
       sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
       super__Vector_impl_data._M_finish[-1].line;
  local_48.colBegin =
       sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
       super__Vector_impl_data._M_finish[-1].colBegin;
  local_54 = EVar7;
  local_50 = EVar6;
  local_4c = uVar5;
  if (bVar2 || bVar9) {
    buff = (char *)operator_new__(0x8000);
  }
  else {
    buff = (char *)0x0;
  }
  ListFile(false);
  iVar4 = ReadLine(false);
  __dest = buff;
  do {
    if (iVar4 == 0) {
      Error("[LUA] Unexpected end of lua script",(char *)0x0,PASS3);
      bVar3 = bVar1;
LAB_0011bfaa:
      if (bVar2 || bVar9) {
        extraErrorWarningPrefix = "[LUA] ";
        *__dest = '\0';
        DidEmitByte();
        L = LUA;
        lua_impl_get_script_name(&local_48);
        iVar4 = luaL_loadbufferx(L,buff,(long)__dest - (long)buff,internal_script_name,(char *)0x0);
        if ((iVar4 != 0) || (iVar4 = lua_pcallk(LUA,0,-1,0,0,(lua_KFunction)0x0), iVar4 != 0)) {
          lua_impl_showLoadError(local_50);
        }
        uVar5 = local_4c;
        extraErrorWarningPrefix = (char *)0x0;
        if (buff != (char *)0x0) {
          operator_delete__(buff);
        }
        bVar2 = DidEmitByte();
        if (bVar3 == false && ((byte)uVar5 & bVar2) == 1) {
          WarningById(W_LUA_MC_PASS,(char *)0x0,local_54);
        }
      }
      CompiledCurrentLine = CompiledCurrentLine + 1;
      substitutedLine = line;
      return;
    }
    lp = line;
    SkipBlanks(&lp);
    iVar4 = cmphstr(&lp,"endlua",false);
    if (iVar4 == 0) {
      pcVar8 = (char *)strlen(line);
    }
    else {
      pcVar8 = lp + -0x18ea26;
    }
    if (bVar2 || bVar9) {
      if (pcVar8 + (long)(__dest + (-0x7ffd - (long)buff)) < (char *)0xffffffffffff7fff) {
        ErrorInt("[LUA] Maximum byte-size of Lua script is",0x7ffc,FATAL);
      }
      memcpy(__dest,line,(size_t)pcVar8);
      pcVar8 = __dest + (long)pcVar8;
      __dest = pcVar8 + 1;
      *pcVar8 = '\n';
    }
    if (iVar4 != 0) {
      skipEmitMessagePos.filename =
           sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].filename;
      skipEmitMessagePos.line =
           sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].line;
      skipEmitMessagePos.colBegin =
           sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].colBegin;
      skipEmitMessagePos.colEnd =
           sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].colEnd;
      CompiledCurrentLine = CompiledCurrentLine + 1;
      lp = ReplaceDefine(lp);
      substitutedLine = line;
      bVar3 = true;
      if (!bVar1) {
        bVar3 = suppressedById(W_LUA_MC_PASS);
      }
      goto LAB_0011bfaa;
    }
    ListFile(true);
    iVar4 = ReadLine(false);
  } while( true );
}

Assistant:

void dirLUA() {
	// lazy init of Lua scripting upon first hit of LUA directive
	if (nullptr == LUA) lua_impl_init();
	assert(LUA);

	constexpr size_t luaBufferSize = 32768;
	char* id, * buff = nullptr, * bp = nullptr;

	int passToExec = LASTPASS;
	if ((id = GetID(lp)) && strlen(id) > 0) {
		if (cmphstr(id, "pass1")) {
			passToExec = 1;
		} else if (cmphstr(id, "pass2")) {
			passToExec = 2;
		} else if (cmphstr(id, "pass3")) {
			passToExec = LASTPASS;
		} else if (cmphstr(id, "allpass")) {
			passToExec = -1;
		} else {
			Error("[LUA] Syntax error", id);
		}
	}

	const EStatus errorType = (1 == passToExec || 2 == passToExec) ? EARLY : PASS3;
	const bool execute = (-1 == passToExec) || (passToExec == pass);
	// remember warning suppression also from block start
	bool showWarning = !suppressedById(W_LUA_MC_PASS);

	assert(!sourcePosStack.empty());
	TextFilePos luaStartPos = sourcePosStack.back();	// position of LUA directive (not ENDLUA)
	if (execute) {
		buff = new char[luaBufferSize];
		bp = buff;
	}
	ListFile();

	while (1) {
		if (!ReadLine(false)) {
			Error("[LUA] Unexpected end of lua script");
			break;
		}
		lp = line;
		SkipBlanks(lp);
		const int isEndLua = cmphstr(lp, "endlua");
		const size_t lineLen = isEndLua ? (lp - 6 - line) : strlen(line);
		if (execute) {
			if (luaBufferSize < (bp - buff) + lineLen + 4) {
				ErrorInt("[LUA] Maximum byte-size of Lua script is", luaBufferSize-4, FATAL);
			}
			memcpy(bp, line, lineLen);
			bp += lineLen;
			*bp++ = '\n';
		}
		if (isEndLua) {		// eat also any trailing eol-type of comment
			skipEmitMessagePos = sourcePosStack.back();
			++CompiledCurrentLine;
			lp = ReplaceDefine(lp);		// skip any empty substitutions and comments
			substitutedLine = line;		// override substituted listing for ENDLUA
			// take into account also warning suppression used at end of block
			showWarning = showWarning && !suppressedById(W_LUA_MC_PASS);
			break;
		}
		ListFile(true);
	}

	if (execute) {
		extraErrorWarningPrefix = lua_err_prefix;
		*bp = 0;
		DidEmitByte();			// reset the flag before running lua script
		if (luaL_loadbuffer(LUA, buff, bp-buff, lua_impl_get_script_name(luaStartPos)) || lua_pcall(LUA, 0, LUA_MULTRET, 0)) {
			lua_impl_showLoadError(errorType);
		}
		extraErrorWarningPrefix = nullptr;
		delete[] buff;
		if (DidEmitByte() && (-1 != passToExec) && showWarning) {
			const EWStatus warningType = (1 == passToExec || 2 == passToExec) ? W_EARLY : W_PASS3;
			WarningById(W_LUA_MC_PASS, nullptr, warningType);
		}
	}

	++CompiledCurrentLine;
	substitutedLine = line;		// override substituted list line for ENDLUA
}